

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

u8 * dec_bs_get_one_unit(com_bs_t *bs,u8 **next_start)

{
  u8 *puVar1;
  int local_58;
  int local_54;
  int left_bytes;
  int len;
  u8 *end;
  u8 *start;
  u8 **next_start_local;
  com_bs_t *bs_local;
  int *piStack_28;
  int i;
  int local_1c;
  u8 *local_18;
  int local_c;
  
  end = bs->cur;
  _left_bytes = bs->end + 1;
  local_54 = (int)_left_bytes - (int)end;
  local_18 = end + 4;
  local_1c = local_54 + -4;
  piStack_28 = &local_58;
  bs_local._4_4_ = 0;
  do {
    if (local_1c <= bs_local._4_4_ + 1) {
      local_c = 0;
LAB_0023190f:
      if (local_c != 0) {
        _left_bytes = end + ((long)local_54 - (long)local_58);
      }
      *next_start = _left_bytes;
      start = (u8 *)next_start;
      next_start_local = (u8 **)bs;
      puVar1 = dec_bs_demulate(end + -1,_left_bytes);
      return puVar1;
    }
    if (((*(uint *)(local_18 + bs_local._4_4_) ^ 0xffffffff) &
         *(int *)(local_18 + bs_local._4_4_) + 0xfefffeffU & 0x80008080) != 0) {
      if ((0 < bs_local._4_4_) && (local_18[bs_local._4_4_] == '\0')) {
        bs_local._4_4_ = bs_local._4_4_ + -1;
      }
      for (; local_18[bs_local._4_4_] != '\0'; bs_local._4_4_ = bs_local._4_4_ + 1) {
      }
      if (((bs_local._4_4_ + 3 < local_1c) && (local_18[bs_local._4_4_ + 1] == '\0')) &&
         (local_18[bs_local._4_4_ + 2] == '\x01')) {
        local_58 = local_1c - bs_local._4_4_;
        local_c = 1;
        goto LAB_0023190f;
      }
      bs_local._4_4_ = bs_local._4_4_ + -3;
    }
    bs_local._4_4_ = bs_local._4_4_ + 5;
  } while( true );
}

Assistant:

u8* dec_bs_get_one_unit(com_bs_t *bs, u8 **next_start)
{
    u8 *start = bs->cur;
    u8 *end   = bs->end + 1;
    int len = (int)(end - start);
    int left_bytes;

    if (dec_bs_find_start_code(start + 4, len - 4, &left_bytes)) {
        end = start + len - left_bytes;
    }

    *next_start = end;

    return dec_bs_demulate(start - 1, end);
}